

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

void duckdb::QuantileScalarOperation<false,duckdb::QuantileStandardType>::
     Finalize<duckdb::timestamp_t,duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *state,
               timestamp_t *target,AggregateFinalizeData *finalize_data)

{
  long lVar1;
  AggregateInputData *this;
  FunctionData *pFVar2;
  date_t *v_t;
  reference pvVar3;
  timestamp_t tVar4;
  idx_t iVar5;
  double dVar6;
  undefined1 auVar7 [16];
  Interpolator<false> interp;
  QuantileDirect<duckdb::date_t> local_79;
  double local_78;
  double dStack_70;
  Interpolator<false> local_60;
  
  if ((state->v).super_vector<duckdb::date_t,_std::allocator<duckdb::date_t>_>.
      super__Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::date_t,_std::allocator<duckdb::date_t>_>.
      super__Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar2 = (this->bind_data).ptr;
    pvVar3 = vector<duckdb::QuantileValue,_true>::operator[]
                       ((vector<duckdb::QuantileValue,_true> *)(pFVar2 + 8),0);
    v_t = (state->v).super_vector<duckdb::date_t,_std::allocator<duckdb::date_t>_>.
          super__Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_>._M_impl.
          super__Vector_impl_data._M_start;
    iVar5 = (long)(state->v).super_vector<duckdb::date_t,_std::allocator<duckdb::date_t>_>.
                  super__Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)v_t >> 2;
    local_60.desc = *(bool *)(pFVar2 + 0x38);
    lVar1 = iVar5 - 1;
    auVar7._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar7._0_8_ = lVar1;
    auVar7._12_4_ = 0x45300000;
    dStack_70 = auVar7._8_8_ - 1.9342813113834067e+25;
    local_78 = (dStack_70 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
               pvVar3->dbl;
    local_60.RN = local_78;
    dVar6 = floor(local_78);
    local_60.FRN = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
    dVar6 = ceil(local_78);
    local_60.CRN = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
    local_60.begin = 0;
    local_60.end = iVar5;
    tVar4 = Interpolator<false>::
            Operation<duckdb::date_t,duckdb::timestamp_t,duckdb::QuantileDirect<duckdb::date_t>>
                      (&local_60,v_t,finalize_data->result,&local_79);
    target->value = (int64_t)tVar4;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		Interpolator<DISCRETE> interp(bind_data.quantiles[0], state.v.size(), bind_data.desc);
		target = interp.template Operation<typename STATE::InputType, T>(state.v.data(), finalize_data.result);
	}